

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

basic_string_view<char,_std::char_traits<char>_> * __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest::
MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__0>
          (undefined8 param_1,undefined8 descriptor)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  FieldDescriptor *descriptor_local;
  DescriptorPoolMemoizationTest *this_local;
  
  pbVar1 = DescriptorPool::
           MemoizeProjection<google::protobuf::FieldDescriptor,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__0>
                     (descriptor);
  return pbVar1;
}

Assistant:

const auto& MemoizeProjection(const Desc* descriptor, Func func) {
    return DescriptorPool::MemoizeProjection(descriptor, func);
  }